

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

int __thiscall jpgd::jpeg_decoder::decode_next_mcu_row(jpeg_decoder *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  iVar3 = _setjmp((__jmp_buf_tag *)this);
  iVar4 = -1;
  if (iVar3 == 0) {
    if (((this->m_flags & 1) == 0) && (this->m_scan_type - 3U < 2)) {
      uVar1 = this->m_pSample_buf;
      uVar2 = this->m_pSample_buf_prev;
      auVar5._8_4_ = (int)uVar1;
      auVar5._0_8_ = uVar2;
      auVar5._12_4_ = (int)((ulong)uVar1 >> 0x20);
      this->m_pSample_buf = (uint8 *)uVar2;
      this->m_pSample_buf_prev = (uint8 *)auVar5._8_8_;
      this->m_sample_buf_prev_valid = true;
    }
    if (this->m_progressive_flag == 0) {
      decode_next_row(this);
    }
    else {
      load_next_row(this);
    }
    iVar3 = this->m_max_mcu_y_size;
    if (this->m_total_lines_left <= iVar3) {
      find_eoi(this);
      iVar3 = this->m_max_mcu_y_size;
    }
    this->m_mcu_lines_left = iVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int jpeg_decoder::decode_next_mcu_row()
	{
		if (::setjmp(m_jmp_state))
			return JPGD_FAILED;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));
		if (chroma_y_filtering)
		{
			std::swap(m_pSample_buf, m_pSample_buf_prev);

			m_sample_buf_prev_valid = true;
		}

		if (m_progressive_flag)
			load_next_row();
		else
			decode_next_row();

		// Find the EOI marker if that was the last row.
		if (m_total_lines_left <= m_max_mcu_y_size)
			find_eoi();

		m_mcu_lines_left = m_max_mcu_y_size;
		return 0;
	}